

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

Var __thiscall
Js::InterpreterStackFrame::InitClassHelper
          (InterpreterStackFrame *this,FrameDisplay *environment,FunctionInfoPtrPtr infoRef,
          RecyclableObject *protoParent,RecyclableObject *constructorParent,RegSlot protoReg)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  DynamicObject *this_00;
  ScriptFunction *this_01;
  
  if (protoParent == (RecyclableObject *)0x0) {
LAB_00956dcc:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1ec6,
                                "(protoParent && JavascriptOperators::IsObjectOrNull(protoParent))",
                                "protoParent && JavascriptOperators::IsObjectOrNull(protoParent)");
    if (!bVar2) goto LAB_00956f00;
    *puVar4 = 0;
  }
  else {
    BVar3 = JavascriptOperators::IsObjectOrNull(protoParent);
    if (BVar3 == 0) goto LAB_00956dcc;
  }
  if (constructorParent != (RecyclableObject *)0x0) {
    bVar2 = JavascriptOperators::IsConstructor(constructorParent);
    if ((bVar2) ||
       (*(RecyclableObject **)(*(long *)(*(long *)(this + 0x78) + 8) + 0x290) == constructorParent))
    goto LAB_00956e90;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x1ec7,
                              "(constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype()))"
                              ,
                              "constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype())"
                             );
  if (!bVar2) {
LAB_00956f00:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_00956e90:
  this_00 = JavascriptLibrary::CreateClassPrototypeObject
                      (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),protoParent);
  this_01 = ScriptFunction::OP_NewClassConstructor(environment,infoRef,this_00,constructorParent);
  DynamicObject::SetSlot(this_00,-1,false,0,this_01);
  DynamicObject::SetSlot((DynamicObject *)this_01,-1,false,0,this_00);
  SetReg<unsigned_int>(this,protoReg,this_00);
  return this_01;
}

Assistant:

Var InterpreterStackFrame::InitClassHelper(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, RecyclableObject *protoParent, RecyclableObject *constructorParent, RegSlot protoReg)
    {
        Assert(protoParent && JavascriptOperators::IsObjectOrNull(protoParent));
        Assert(constructorParent && (JavascriptOperators::IsConstructor(constructorParent) || constructorParent == scriptContext->GetLibrary()->GetFunctionPrototype()));

        // Create prototype object with the default class prototype object shape {'constructor': W:T, E:F, C:T} and [[Prototype]] == protoParent
        DynamicObject * proto = scriptContext->GetLibrary()->CreateClassPrototypeObject(protoParent);

        // Create class constructor object for the constructor function, with default constructor shape:
        //    {'prototype': W:F, E:F, C:F}, {'length': W:F, E:F, C:T}, {'name': W:F, E:F, C:T}
        //    [[Prototype]] == constructorParent and [[HomeObject]] == proto
        // The callee initializes the object and the 3 properties.
        ScriptFunction * constructor = ScriptFunction::OP_NewClassConstructor(environment, infoRef, proto, constructorParent);

        proto->SetSlot(SetSlotArguments(Constants::NoProperty, 0, constructor));
        constructor->SetSlot(SetSlotArguments(Constants::NoProperty, 0, proto));

        SetReg(protoReg, proto);
        return constructor;
    }